

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O3

void __thiscall
CVmObjTimeZone::restore_from_file
          (CVmObjTimeZone *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  size_t len;
  CVmTimeZone *pCVar2;
  undefined4 extraout_var;
  char name [256];
  os_tzinfo_t local_184;
  int local_128 [64];
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  local_184.dst_end.month = 0;
  local_184.dst_end.week = 0;
  local_184.dst_end.day = 0;
  local_184.dst_end.time = 0;
  local_184.dst_start.day = 0;
  local_184.dst_start.time = 0;
  local_184.dst_end.jday = 0;
  local_184.dst_end.yday = 0;
  local_184.dst_start.jday = 0;
  local_184.dst_start.yday = 0;
  local_184.dst_start.month = 0;
  local_184.dst_start.week = 0;
  local_184.dst_abbr[0] = '\0';
  local_184.dst_abbr[1] = '\0';
  local_184.dst_abbr[2] = '\0';
  local_184.dst_abbr[3] = '\0';
  local_184.dst_abbr[4] = '\0';
  local_184.dst_abbr[5] = '\0';
  local_184.dst_abbr[6] = '\0';
  local_184.dst_abbr[7] = '\0';
  local_184.dst_abbr[8] = '\0';
  local_184.dst_abbr[9] = '\0';
  local_184.dst_abbr[10] = '\0';
  local_184.dst_abbr[0xb] = '\0';
  local_184.dst_abbr[0xc] = '\0';
  local_184.dst_abbr[0xd] = '\0';
  local_184.dst_abbr[0xe] = '\0';
  local_184.dst_abbr[0xf] = '\0';
  local_184.std_abbr[0] = '\0';
  local_184.std_abbr[1] = '\0';
  local_184.std_abbr[2] = '\0';
  local_184.std_abbr[3] = '\0';
  local_184.std_abbr[4] = '\0';
  local_184.std_abbr[5] = '\0';
  local_184.std_abbr[6] = '\0';
  local_184.std_abbr[7] = '\0';
  local_184.std_abbr[8] = '\0';
  local_184.std_abbr[9] = '\0';
  local_184.std_abbr[10] = '\0';
  local_184.std_abbr[0xb] = '\0';
  local_184.std_abbr[0xc] = '\0';
  local_184.std_abbr[0xd] = '\0';
  local_184.std_abbr[0xe] = '\0';
  local_184.std_abbr[0xf] = '\0';
  local_184.is_dst = 0;
  CVmFile::read_bytes(fp,(char *)local_128,4);
  iVar1 = local_128[0] / 1000;
  local_184.std_ofs = iVar1;
  CVmFile::read_bytes(fp,(char *)local_128,4);
  local_184.dst_ofs = local_128[0] / 1000 + iVar1;
  CVmFile::read_str_byte_prefix(fp,local_184.std_abbr,0x10);
  strcpy(local_184.dst_abbr,local_184.std_abbr);
  len = CVmFile::read_str_byte_prefix(fp,(char *)local_128,0x100);
  pCVar2 = CVmTimeZoneCache::parse_zone(G_tzcache_X,(char *)local_128,len);
  if (pCVar2 == (CVmTimeZone *)0x0) {
    pCVar2 = CVmTimeZoneCache::create_missing_zone(G_tzcache_X,(char *)local_128,len,&local_184);
  }
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,this);
  *(CVmTimeZone **)CONCAT44(extraout_var,iVar1) = pCVar2;
  (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

void CVmObjTimeZone::restore_from_file(VMG_ vm_obj_id_t self,
                                       CVmFile *fp, CVmObjFixup *fixups)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* 
     *   Read the GMT and DST offsets (in case we need a synthetic entry).
     *   Note that the saved values are in milliseconds, but os_tzinfo_t
     *   works in seconds, so adjust accordingly. 
     */
    os_tzinfo_t desc;
    memset(&desc, 0, sizeof(desc));
    desc.std_ofs = fp->read_int4() / 1000;
    desc.dst_ofs = desc.std_ofs + fp->read_int4() / 1000;

    /* read the abbreviation */
    fp->read_str_byte_prefix(desc.std_abbr, sizeof(desc.std_abbr));
    strcpy(desc.dst_abbr, desc.std_abbr);

    /* read the length and name */
    char name[256];
    size_t len = fp->read_str_byte_prefix(name, sizeof(name));

    /* look up our timezone object */
    CVmTimeZone *tz = G_tzcache->parse_zone(vmg_ name, len);

    /* if we didn't find it, create a dummy entry for it */
    if (tz == 0)
        tz = G_tzcache->create_missing_zone(vmg_ name, len, &desc);

    /* allocate the extension structure */
    vm_tzobj_ext *ext = vm_tzobj_ext::alloc_ext(vmg_ this, tz);
    ext_ = (char *)ext;
}